

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O3

string * __thiscall Fraction::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,Fraction *this)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long *plVar5;
  undefined8 *puVar6;
  uint uVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  ulong uVar11;
  uint uVar12;
  string __str;
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (this->denominator_ == 1) {
    uVar1 = this->numerator_;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar12 = 1;
    if (9 < uVar2) {
      uVar11 = (ulong)uVar2;
      uVar4 = 4;
      do {
        uVar12 = uVar4;
        uVar7 = (uint)uVar11;
        if (uVar7 < 100) {
          uVar12 = uVar12 - 2;
          goto LAB_00106c8a;
        }
        if (uVar7 < 1000) {
          uVar12 = uVar12 - 1;
          goto LAB_00106c8a;
        }
        if (uVar7 < 10000) goto LAB_00106c8a;
        uVar11 = uVar11 / 10000;
        uVar4 = uVar12 + 4;
      } while (99999 < uVar7);
      uVar12 = uVar12 + 1;
    }
LAB_00106c8a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)uVar12 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar1 >> 0x1f),uVar12,uVar2);
    return __return_storage_ptr__;
  }
  uVar1 = this->numerator_;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar12 = 1;
  if (9 < uVar2) {
    uVar11 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar12 = uVar4;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_00106cc0;
      }
      if (uVar7 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_00106cc0;
      }
      if (uVar7 < 10000) goto LAB_00106cc0;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar12 + 4;
    } while (99999 < uVar7);
    uVar12 = uVar12 + 1;
  }
LAB_00106cc0:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar12 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50[0] + (ulong)(uVar1 >> 0x1f)),uVar12,uVar2);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x110242);
  local_90 = &local_80;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70 = &local_60;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_c0 = *puVar9;
    lStack_b8 = plVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar9;
    local_d0 = (ulong *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar1 = this->denominator_;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar12 = 1;
  if (9 < uVar2) {
    uVar11 = (ulong)uVar2;
    uVar4 = 4;
    do {
      uVar12 = uVar4;
      uVar7 = (uint)uVar11;
      if (uVar7 < 100) {
        uVar12 = uVar12 - 2;
        goto LAB_00106e74;
      }
      if (uVar7 < 1000) {
        uVar12 = uVar12 - 1;
        goto LAB_00106e74;
      }
      if (uVar7 < 10000) goto LAB_00106e74;
      uVar11 = uVar11 / 10000;
      uVar4 = uVar12 + 4;
    } while (99999 < uVar7);
    uVar12 = uVar12 + 1;
  }
LAB_00106e74:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar12 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_b0),uVar12,uVar2);
  uVar11 = 0xf;
  if (local_d0 != &local_c0) {
    uVar11 = local_c0;
  }
  if (uVar11 < (ulong)(local_a8 + local_c8)) {
    uVar11 = 0xf;
    if (local_b0 != local_a0) {
      uVar11 = local_a0[0];
    }
    if ((ulong)(local_a8 + local_c8) <= uVar11) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_00106f00;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_00106f00:
  local_f0 = &local_e0;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_e0 = *plVar5;
    uStack_d8 = puVar6[3];
  }
  else {
    local_e0 = *plVar5;
    local_f0 = (long *)*puVar6;
  }
  local_e8 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Fraction::ToLaTex() const {
  if (denominator_ == 1) {
    return std::to_string(numerator_);
  }
  return "\\frac{" + std::to_string(numerator_) + "}" +
      "{" + std::to_string(denominator_) + "}";
}